

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O0

PropertyDefinition * __thiscall
Rml::PropertySpecification::RegisterProperty
          (PropertySpecification *this,String *property_name,String *default_value,bool inherited,
          bool forces_layout,PropertyId id)

{
  code *pcVar1;
  bool bVar2;
  IdNameMap<Rml::PropertyId> *pIVar3;
  ulong uVar4;
  undefined8 uVar5;
  reference pvVar6;
  size_type sVar7;
  unique_ptr *this_00;
  type pPVar8;
  unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_> local_40;
  ulong local_38;
  size_t index;
  PropertyId id_local;
  bool forces_layout_local;
  String *pSStack_28;
  bool inherited_local;
  String *default_value_local;
  String *property_name_local;
  PropertySpecification *this_local;
  
  index._5_1_ = id;
  index._6_1_ = forces_layout;
  index._7_1_ = inherited;
  pSStack_28 = default_value;
  default_value_local = property_name;
  property_name_local = (String *)this;
  if (id == Invalid) {
    pIVar3 = &::std::
              unique_ptr<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>::
              operator->(&this->property_map)->super_IdNameMap<Rml::PropertyId>;
    index._5_1_ = IdNameMap<Rml::PropertyId>::GetOrCreateId(pIVar3,default_value_local);
  }
  else {
    pIVar3 = &::std::
              unique_ptr<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>::
              operator->(&this->property_map)->super_IdNameMap<Rml::PropertyId>;
    IdNameMap<Rml::PropertyId>::AddPair(pIVar3,index._5_1_,default_value_local);
  }
  uVar4 = (ulong)index._5_1_;
  local_38 = uVar4;
  if (uVar4 < 0x80) {
    sVar7 = ::std::
            vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
            ::size(&this->properties);
    if (uVar4 < sVar7) {
      this_00 = (unique_ptr *)
                ::std::
                vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
                ::operator[](&this->properties,local_38);
      bVar2 = ::std::unique_ptr::operator_cast_to_bool(this_00);
      if (bVar2) {
        uVar5 = ::std::__cxx11::string::c_str();
        Log::Message(LT_ERROR,
                     "While registering property \'%s\': The property is already registered.",uVar5)
        ;
        pvVar6 = ::std::
                 vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
                 ::operator[](&this->properties,local_38);
        pPVar8 = ::std::
                 unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
                 ::operator*(pvVar6);
        return pPVar8;
      }
    }
    else {
      ::std::
      vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ::resize(&this->properties,(local_38 * 3 >> 1) + 1);
    }
    MakeUnique<Rml::PropertyDefinition,Rml::PropertyId&,std::__cxx11::string_const&,bool&,bool&>
              ((PropertyId *)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&index + 5),(bool *)pSStack_28,(bool *)((long)&index + 7));
    pvVar6 = ::std::
             vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
             ::operator[](&this->properties,local_38);
    ::std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>::
    operator=(pvVar6,&local_40);
    ::std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>::
    ~unique_ptr(&local_40);
    PropertyIdSet::Insert(&this->property_ids,index._5_1_);
    if ((index._7_1_ & 1) != 0) {
      PropertyIdSet::Insert(&this->property_ids_inherited,index._5_1_);
    }
    if ((index._6_1_ & 1) != 0) {
      PropertyIdSet::Insert(&this->property_ids_forcing_layout,index._5_1_);
    }
    pvVar6 = ::std::
             vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
             ::operator[](&this->properties,local_38);
    this_local = (PropertySpecification *)
                 ::std::
                 unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
                 ::operator*(pvVar6);
  }
  else {
    uVar5 = ::std::__cxx11::string::c_str();
    Log::Message(LT_ERROR,
                 "Fatal error while registering property \'%s\': Maximum number of allowed properties exceeded. Continuing execution may lead to crash."
                 ,uVar5);
    bVar2 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                   ,0x42);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pvVar6 = ::std::
             vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
             ::operator[](&this->properties,0);
    this_local = (PropertySpecification *)
                 ::std::
                 unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
                 ::operator*(pvVar6);
  }
  return (PropertyDefinition *)this_local;
}

Assistant:

PropertyDefinition& PropertySpecification::RegisterProperty(const String& property_name, const String& default_value, bool inherited,
	bool forces_layout, PropertyId id)
{
	if (id == PropertyId::Invalid)
		id = property_map->GetOrCreateId(property_name);
	else
		property_map->AddPair(id, property_name);

	size_t index = (size_t)id;

	if (index >= size_t(PropertyId::MaxNumIds))
	{
		Log::Message(Log::LT_ERROR,
			"Fatal error while registering property '%s': Maximum number of allowed properties exceeded. Continuing execution may lead to crash.",
			property_name.c_str());
		RMLUI_ERROR;
		return *properties[0];
	}

	if (index < properties.size())
	{
		// We don't want to owerwrite an existing entry.
		if (properties[index])
		{
			Log::Message(Log::LT_ERROR, "While registering property '%s': The property is already registered.", property_name.c_str());
			return *properties[index];
		}
	}
	else
	{
		// Resize vector to hold the new index
		properties.resize((index * 3) / 2 + 1);
	}

	// Create and insert the new property
	properties[index] = MakeUnique<PropertyDefinition>(id, default_value, inherited, forces_layout);
	property_ids.Insert(id);
	if (inherited)
		property_ids_inherited.Insert(id);
	if (forces_layout)
		property_ids_forcing_layout.Insert(id);

	return *properties[index];
}